

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O0

void __thiscall mocker::ir::Reg::~Reg(Reg *this)

{
  Reg *this_local;
  
  ~Reg(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit Reg(std::string identifier) : identifier(std::move(identifier)) {}